

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

bool __thiscall helics::Federate::isQueryCompleted(Federate *this,QueryId *queryIndex)

{
  bool bVar1;
  future_status fVar2;
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U> *in_RSI;
  long in_RDI;
  iterator fnd;
  handle asyncInfo;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_64;
  duration<long,std::ratio<1l,1l>> local_60 [8];
  _Self local_58 [3];
  uint local_3c;
  _Self local_38;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_30;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x35221a);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_ffffffffffffff58);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(&local_30);
    local_3c = IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U>::value(in_RSI);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::find((map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_ffffffffffffff58,(key_type *)0x35225c);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(&local_30);
    local_58[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end((map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_ffffffffffffff58);
    bVar1 = std::operator==(&local_38,local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_1 = false;
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x3522a9);
      local_64 = 0;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_60,&local_64);
      fVar2 = std::__basic_future<std::__cxx11::string>::wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff58);
      local_1 = fVar2 == ready;
    }
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x352331);
  }
  else {
    local_1 = false;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Federate::isQueryCompleted(QueryId queryIndex) const  // NOLINT
{
    if (singleThreadFederate) {
        return false;
    }
    auto asyncInfo = asyncCallInfo->lock();
    auto fnd = asyncInfo->inFlightQueries.find(queryIndex.value());
    if (fnd != asyncInfo->inFlightQueries.end()) {
        return (fnd->second.wait_for(std::chrono::seconds(0)) == std::future_status::ready);
    }
    return false;
}